

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

void ps_expand_file_config(ps_config_t *config,char *arg,char *hmmdir,char *file)

{
  int iVar1;
  char *pcVar2;
  char *tmp;
  char *val;
  char *file_local;
  char *hmmdir_local;
  char *arg_local;
  ps_config_t *config_local;
  
  pcVar2 = ps_config_str(config,arg);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = string_join(hmmdir,"/",file,0);
    iVar1 = file_exists(pcVar2);
    if (iVar1 == 0) {
      ps_config_set_str(config,arg,(char *)0x0);
    }
    else {
      ps_config_set_str(config,arg,pcVar2);
    }
    ckd_free(pcVar2);
  }
  return;
}

Assistant:

static void
ps_expand_file_config(ps_config_t *config, const char *arg,
	              const char *hmmdir, const char *file)
{
    const char *val;
    if ((val = ps_config_str(config, arg)) == NULL) {
        char *tmp = string_join(hmmdir, "/", file, NULL);
        if (file_exists(tmp))
	    ps_config_set_str(config, arg, tmp);
	else
	    ps_config_set_str(config, arg, NULL);
        ckd_free(tmp);
    }
}